

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

void __thiscall Character::DeathRespawn(Character *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  World *pWVar2;
  EOClient *pEVar3;
  bool bVar4;
  mapped_type *pmVar5;
  Home *pHVar6;
  Map *pMVar7;
  size_t sVar8;
  double dVar9;
  char local_7a [2];
  PacketReader local_78;
  string local_50;
  double local_30;
  
  local_30 = (double)this->maxhp;
  pWVar2 = this->world;
  paVar1 = &local_78.data.field_2;
  local_78.data._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"DeathRecover","");
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar2->config,&local_78.data);
  dVar9 = util::variant::GetFloat(pmVar5);
  this->hp = (int)((dVar9 * local_30) / 100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.data._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.data._M_dataplus._M_p,local_78.data.field_2._M_allocated_capacity + 1);
  }
  pWVar2 = this->world;
  local_78.data._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Deadly","");
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar2->config,&local_78.data);
  bVar4 = util::variant::GetBool(pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.data._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.data._M_dataplus._M_p,local_78.data.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    DropAll(this,(Character *)0x0);
  }
  Map::Leave(this->map,this,WARP_ANIMATION_NONE,true);
  this->nowhere = true;
  pWVar2 = this->world;
  pHVar6 = World::GetHome(pWVar2,this);
  pMVar7 = World::GetMap(pWVar2,pHVar6->map);
  this->map = pMVar7;
  pHVar6 = World::GetHome(this->world,this);
  this->mapid = pHVar6->map;
  pHVar6 = World::GetHome(this->world,this);
  this->x = pHVar6->x;
  pHVar6 = World::GetHome(this->world,this);
  this->y = pHVar6->y;
  pEVar3 = this->player->client;
  local_7a[0] = -0x80;
  local_7a[1] = '\0';
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  sVar8 = strlen(local_7a);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_7a,local_7a + sVar8);
  PacketReader::PacketReader(&local_78,&local_50);
  ActionQueue::AddAction(&pEVar3->queue,&local_78,1.5,false);
  PacketReader::~PacketReader(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pEVar3 = this->player->client;
  local_7a[0] = -0x7f;
  local_7a[1] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  sVar8 = strlen(local_7a);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_7a,local_7a + sVar8);
  PacketReader::PacketReader(&local_78,&local_50);
  ActionQueue::AddAction(&pEVar3->queue,&local_78,0.0,false);
  PacketReader::~PacketReader(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Character::DeathRespawn()
{
	this->hp = int(this->maxhp * static_cast<double>(this->world->config["DeathRecover"]) / 100.0);

	if (this->world->config["Deadly"])
	{
		this->DropAll(nullptr);
	}

	this->map->Leave(this, WARP_ANIMATION_NONE, true);
	this->nowhere = true;
	this->map = this->world->GetMap(this->SpawnMap());
	this->mapid = this->SpawnMap();
	this->x = this->SpawnX();
	this->y = this->SpawnY();

	this->player->client->queue.AddAction(PacketReader(std::array<char, 2>{
		{char(PACKET_INTERNAL_NULL), char(PACKET_INTERNAL)}
	}.data()), 1.5);

	this->player->client->queue.AddAction(PacketReader(std::array<char, 2>{
		{char(PACKET_INTERNAL_WARP), char(PACKET_INTERNAL)}
	}.data()), 0.0);
}